

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

char * archive_entry_uname(archive_entry *entry)

{
  wchar_t wVar1;
  int *piVar2;
  archive_entry *local_20;
  char *p;
  archive_entry *entry_local;
  
  p = (char *)entry;
  wVar1 = archive_mstring_get_mbs(entry->archive,&entry->ae_uname,(char **)&local_20);
  if (wVar1 == L'\0') {
    entry_local = local_20;
  }
  else {
    piVar2 = __errno_location();
    if (*piVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    entry_local = (archive_entry *)0x0;
  }
  return (char *)entry_local;
}

Assistant:

const char *
archive_entry_uname(struct archive_entry *entry)
{
	const char *p;
	if (archive_mstring_get_mbs(entry->archive, &entry->ae_uname, &p) == 0)
		return (p);
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}